

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void absl::lts_20240722::container_internal::
     btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
     ::clear_and_delete(btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                        *node,allocator_type *alloc)

{
  bool bVar1;
  field_type fVar2;
  byte bVar3;
  field_type fVar4;
  size_type sVar5;
  btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
  *pbVar6;
  btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
  *this;
  btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
  *local_30;
  btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
  *parent;
  size_type pos;
  btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
  *delete_root_parent;
  allocator_type *alloc_local;
  btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
  *node_local;
  
  bVar1 = is_leaf(node);
  if (bVar1) {
    fVar2 = start(node);
    fVar4 = count(node);
    value_destroy_n(node,fVar2,fVar4,alloc);
    bVar3 = max_count(node);
    sVar5 = LeafSize((ulong)bVar3);
    deallocate(sVar5,node,alloc);
  }
  else {
    fVar2 = count(node);
    if (fVar2 != '\0') {
      pbVar6 = btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
               ::parent(node);
      alloc_local = (allocator_type *)node;
      while (bVar1 = is_internal((btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                                  *)alloc_local), bVar1) {
        alloc_local = (allocator_type *)
                      start_child((btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                                   *)alloc_local);
      }
      bVar3 = position((btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                        *)alloc_local);
      parent = (btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                *)(ulong)bVar3;
      local_30 = btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                 ::parent((btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                           *)alloc_local);
      while( true ) {
        bVar3 = finish(local_30);
        if ((btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
             *)(ulong)bVar3 < parent) {
          __assert_fail("pos <= parent->finish()",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                        ,0x7ef,
                        "static void absl::container_internal::btree_node<absl::container_internal::map_params<google::protobuf::internal::VariantKey, google::protobuf::internal::NodeBase *, std::less<google::protobuf::internal::VariantKey>, google::protobuf::internal::MapAllocator<std::pair<const google::protobuf::internal::VariantKey, google::protobuf::internal::NodeBase *>>, 256, false>>::clear_and_delete(btree_node<Params> *, allocator_type *) [Params = absl::container_internal::map_params<google::protobuf::internal::VariantKey, google::protobuf::internal::NodeBase *, std::less<google::protobuf::internal::VariantKey>, google::protobuf::internal::MapAllocator<std::pair<const google::protobuf::internal::VariantKey, google::protobuf::internal::NodeBase *>>, 256, false>]"
                       );
        }
        do {
          alloc_local = (allocator_type *)child(local_30,(field_type)parent);
          bVar1 = is_internal((btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                               *)alloc_local);
          if (bVar1) {
            while (bVar1 = is_internal((btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                                        *)alloc_local), bVar1) {
              alloc_local = (allocator_type *)
                            start_child((btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                                         *)alloc_local);
            }
            bVar3 = position((btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                              *)alloc_local);
            parent = (btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                      *)(ulong)bVar3;
            local_30 = btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                       ::parent((btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                                 *)alloc_local);
          }
          fVar2 = start((btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                         *)alloc_local);
          fVar4 = count((btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                         *)alloc_local);
          value_destroy_n((btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                           *)alloc_local,fVar2,fVar4,alloc);
          bVar3 = max_count((btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                             *)alloc_local);
          sVar5 = LeafSize((ulong)bVar3);
          deallocate(sVar5,(btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                            *)alloc_local,alloc);
          parent = parent + 1;
          bVar3 = finish(local_30);
        } while (parent <= (btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                            *)(ulong)bVar3);
        bVar3 = finish(local_30);
        if (parent <= (btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                       *)(ulong)bVar3) break;
        do {
          bVar3 = position(local_30);
          this = btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                 ::parent(local_30);
          fVar2 = start(local_30);
          fVar4 = count(local_30);
          value_destroy_n(local_30,fVar2,fVar4,alloc);
          sVar5 = InternalSize();
          deallocate(sVar5,local_30,alloc);
          if (this == pbVar6) {
            return;
          }
          parent = (btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                    *)((ulong)bVar3 + 1);
          bVar3 = finish(this);
          local_30 = this;
        } while ((btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                  *)(ulong)bVar3 < parent);
      }
      __assert_fail("pos > parent->finish()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                    ,0x801,
                    "static void absl::container_internal::btree_node<absl::container_internal::map_params<google::protobuf::internal::VariantKey, google::protobuf::internal::NodeBase *, std::less<google::protobuf::internal::VariantKey>, google::protobuf::internal::MapAllocator<std::pair<const google::protobuf::internal::VariantKey, google::protobuf::internal::NodeBase *>>, 256, false>>::clear_and_delete(btree_node<Params> *, allocator_type *) [Params = absl::container_internal::map_params<google::protobuf::internal::VariantKey, google::protobuf::internal::NodeBase *, std::less<google::protobuf::internal::VariantKey>, google::protobuf::internal::MapAllocator<std::pair<const google::protobuf::internal::VariantKey, google::protobuf::internal::NodeBase *>>, 256, false>]"
                   );
    }
    sVar5 = InternalSize();
    deallocate(sVar5,node,alloc);
  }
  return;
}

Assistant:

void btree_node<P>::clear_and_delete(btree_node *node, allocator_type *alloc) {
  if (node->is_leaf()) {
    node->value_destroy_n(node->start(), node->count(), alloc);
    deallocate(LeafSize(node->max_count()), node, alloc);
    return;
  }
  if (node->count() == 0) {
    deallocate(InternalSize(), node, alloc);
    return;
  }

  // The parent of the root of the subtree we are deleting.
  btree_node *delete_root_parent = node->parent();

  // Navigate to the leftmost leaf under node, and then delete upwards.
  while (node->is_internal()) node = node->start_child();
#ifdef ABSL_BTREE_ENABLE_GENERATIONS
  // When generations are enabled, we delete the leftmost leaf last in case it's
  // the parent of the root and we need to check whether it's a leaf before we
  // can update the root's generation.
  // TODO(ezb): if we change btree_node::is_root to check a bool inside the node
  // instead of checking whether the parent is a leaf, we can remove this logic.
  btree_node *leftmost_leaf = node;
#endif
  // Use `size_type` because `pos` needs to be able to hold `kNodeSlots+1`,
  // which isn't guaranteed to be a valid `field_type`.
  size_type pos = node->position();
  btree_node *parent = node->parent();
  for (;;) {
    // In each iteration of the next loop, we delete one leaf node and go right.
    assert(pos <= parent->finish());
    do {
      node = parent->child(static_cast<field_type>(pos));
      if (node->is_internal()) {
        // Navigate to the leftmost leaf under node.
        while (node->is_internal()) node = node->start_child();
        pos = node->position();
        parent = node->parent();
      }
      node->value_destroy_n(node->start(), node->count(), alloc);
#ifdef ABSL_BTREE_ENABLE_GENERATIONS
      if (leftmost_leaf != node)
#endif
        deallocate(LeafSize(node->max_count()), node, alloc);
      ++pos;
    } while (pos <= parent->finish());

    // Once we've deleted all children of parent, delete parent and go up/right.
    assert(pos > parent->finish());
    do {
      node = parent;
      pos = node->position();
      parent = node->parent();
      node->value_destroy_n(node->start(), node->count(), alloc);
      deallocate(InternalSize(), node, alloc);
      if (parent == delete_root_parent) {
#ifdef ABSL_BTREE_ENABLE_GENERATIONS
        deallocate(LeafSize(leftmost_leaf->max_count()), leftmost_leaf, alloc);
#endif
        return;
      }
      ++pos;
    } while (pos > parent->finish());
  }
}